

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O0

ogg_int32_t toBARK(int n)

{
  int del;
  int gap;
  int i;
  int n_local;
  
  del = 0;
  while ((del < 0x1b && ((n < barklook[del] || (barklook[del + 1] <= n))))) {
    del = del + 1;
  }
  if (del == 0x1b) {
    i = 0xd8000;
  }
  else {
    i = del * 0x8000 + ((n - barklook[del]) * 0x8000) / (barklook[del + 1] - barklook[del]);
  }
  return i;
}

Assistant:

STIN ogg_int32_t toBARK(int n){
  int i;
  for(i=0;i<27;i++) 
    if(n>=barklook[i] && n<barklook[i+1])break;
  
  if(i==27){
    return 27<<15;
  }else{
    int gap=barklook[i+1]-barklook[i];
    int del=n-barklook[i];

    return((i<<15)+((del<<15)/gap));
  }
}